

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O1

bool __thiscall FpgaIO::PromSectorErase(FpgaIO *this,uint32_t addr,ProgressCallback cb)

{
  BasePort *pBVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined8 in_RAX;
  uint32_t status;
  undefined8 uStack_38;
  
  pBVar1 = (this->super_BoardIO).port;
  uStack_38 = in_RAX;
  (*pBVar1->_vptr_BasePort[0x24])(pBVar1,(ulong)(this->super_BoardIO).BoardId,8,0x6000000);
  pBVar1 = (this->super_BoardIO).port;
  iVar4 = (*pBVar1->_vptr_BasePort[0x24])
                    (pBVar1,(ulong)(this->super_BoardIO).BoardId,8,
                     (ulong)(addr & 0xffffff | 0xd8000000));
  if (((char)iVar4 == '\0') ||
     (bVar2 = PromGetStatus(this,(uint32_t *)((long)&uStack_38 + 4),PROM_M25P16), !bVar2)) {
    bVar2 = false;
  }
  else {
    do {
      bVar2 = uStack_38._4_4_ == 0;
      if (bVar2) {
        return bVar2;
      }
      if (cb == (ProgressCallback)0x0) {
        uStack_38._0_4_ = CONCAT13(0x2e,(undefined3)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)((long)&uStack_38 + 3),1);
      }
      else {
        bVar3 = (*cb)((char *)0x0);
        if (!bVar3) {
          return bVar2;
        }
      }
      bVar3 = PromGetStatus(this,(uint32_t *)((long)&uStack_38 + 4),PROM_M25P16);
    } while (bVar3);
  }
  return bVar2;
}

Assistant:

bool FpgaIO::PromSectorErase(uint32_t addr, const ProgressCallback cb)
{
    PromWriteEnable();
    quadlet_t write_data = 0xd8000000 | (addr&0x00ffffff);
    if (!port->WriteQuadlet(BoardId, 0x08, write_data))
        return false;
    // Wait for erase to finish
    uint32_t status;
    if (!PromGetStatus(status))
        return false;
    while (status) {
        PROGRESS_CALLBACK(cb, false);
        if (!PromGetStatus(status))
            return false;
    }
    return true;
}